

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
fasttext::FastText::getNNMod
          (vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,FastText *this,string *word,int32_t k,int factor,bool addWo)

{
  pointer pcVar1;
  int32_t iVar2;
  DenseMatrix *this_00;
  DenseMatrix *pDVar3;
  undefined7 in_register_00000089;
  long lVar4;
  real rVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Vector vec;
  string word_1;
  Vector query;
  allocator_type local_b2;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_b1;
  int32_t local_b0;
  float local_ac;
  undefined1 local_a8 [32];
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_88;
  string *local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  Vector local_48;
  
  local_b0 = k;
  Vector::Vector(&local_48,
                 (long)((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->dim);
  local_ac = (float)(int)CONCAT71(in_register_00000089,addWo);
  getWordVector(this,&local_48,word,factor,local_ac);
  pDVar3 = (this->wordVectorsMod)._M_t.
           super___uniq_ptr_impl<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
           ._M_t.
           super__Tuple_impl<0UL,_fasttext::DenseMatrix_*,_std::default_delete<fasttext::DenseMatrix>_>
           .super__Head_base<0UL,_fasttext::DenseMatrix_*,_false>._M_head_impl;
  local_80 = word;
  if (pDVar3 == (DenseMatrix *)0x0) {
    this_00 = (DenseMatrix *)operator_new(0x30);
    iVar2 = Dictionary::nwords((this->dict_).
                               super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
    DenseMatrix::DenseMatrix
              (this_00,(long)iVar2,
               (long)((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->dim);
    pDVar3 = (this->wordVectorsMod)._M_t.
             super___uniq_ptr_impl<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
             ._M_t.
             super__Tuple_impl<0UL,_fasttext::DenseMatrix_*,_std::default_delete<fasttext::DenseMatrix>_>
             .super__Head_base<0UL,_fasttext::DenseMatrix_*,_false>._M_head_impl;
    (this->wordVectorsMod)._M_t.
    super___uniq_ptr_impl<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>._M_t.
    super__Tuple_impl<0UL,_fasttext::DenseMatrix_*,_std::default_delete<fasttext::DenseMatrix>_>.
    super__Head_base<0UL,_fasttext::DenseMatrix_*,_false>._M_head_impl = this_00;
    if (pDVar3 != (DenseMatrix *)0x0) {
      (**(code **)((long)(pDVar3->super_Matrix)._vptr_Matrix + 8))();
    }
    Vector::Vector((Vector *)local_a8,
                   (long)((this->args_).
                          super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         dim);
    local_88 = __return_storage_ptr__;
    DenseMatrix::zero((this->wordVectorsMod)._M_t.
                      super___uniq_ptr_impl<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_fasttext::DenseMatrix_*,_std::default_delete<fasttext::DenseMatrix>_>
                      .super__Head_base<0UL,_fasttext::DenseMatrix_*,_false>._M_head_impl);
    lVar4 = 0;
    while( true ) {
      iVar2 = Dictionary::nwords((this->dict_).
                                 super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr);
      if (iVar2 <= lVar4) break;
      Dictionary::getWord_abi_cxx11_
                ((string *)&local_78,
                 (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(int32_t)lVar4);
      getWordVector(this,(Vector *)local_a8,(string *)&local_78,factor,local_ac);
      rVar5 = Vector::norm((Vector *)local_a8);
      if (0.0 < rVar5) {
        pDVar3 = (this->wordVectorsMod)._M_t.
                 super___uniq_ptr_impl<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_fasttext::DenseMatrix_*,_std::default_delete<fasttext::DenseMatrix>_>
                 .super__Head_base<0UL,_fasttext::DenseMatrix_*,_false>._M_head_impl;
        (**(code **)((long)(pDVar3->super_Matrix)._vptr_Matrix + 0x18))
                  (1.0 / rVar5,pDVar3,(Vector *)local_a8,lVar4);
      }
      if ((_Base_ptr *)local_78._M_impl._0_8_ !=
          &local_78._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)local_78._M_impl._0_8_);
      }
      lVar4 = lVar4 + 1;
    }
    if ((pointer)local_a8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_a8._0_8_);
    }
    pDVar3 = (this->wordVectorsMod)._M_t.
             super___uniq_ptr_impl<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
             ._M_t.
             super__Tuple_impl<0UL,_fasttext::DenseMatrix_*,_std::default_delete<fasttext::DenseMatrix>_>
             .super__Head_base<0UL,_fasttext::DenseMatrix_*,_false>._M_head_impl;
    __return_storage_ptr__ = local_88;
  }
  pcVar1 = (local_80->_M_dataplus)._M_p;
  local_a8._0_8_ = local_a8 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a8,pcVar1,pcVar1 + local_80->_M_string_length);
  __l._M_len = 1;
  __l._M_array = (iterator)local_a8;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_78,__l,&local_b1,&local_b2);
  getNN(__return_storage_ptr__,this,pDVar3,&local_48,local_b0,
        (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_78);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_78);
  if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
    operator_delete((void *)local_a8._0_8_);
  }
  if (local_48.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<real, std::string>> FastText::getNNMod(const std::string &word, int32_t k, int factor, bool addWo) {
    Vector query(args_->dim);
    getWordVector(query, word, factor, addWo);
    if (!wordVectorsMod) {
        wordVectorsMod = std::unique_ptr<DenseMatrix>(
                new DenseMatrix(dict_->nwords(), args_->dim));
        Vector vec(args_->dim);

        wordVectorsMod->zero();
        for (int32_t i = 0; i < dict_->nwords(); i++) {
            std::string word = dict_->getWord(i);
            getWordVector(vec, word,factor, addWo);
            real norm = vec.norm();
            if (norm > 0) {
                wordVectorsMod->addVectorToRow(vec, i, 1.0 / norm);
            }
        }
    }
    return getNN(*wordVectorsMod, query, k, {word});
}